

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextstream.cpp
# Opt level: O2

bool __thiscall
QTextStreamPrivate::scan
          (QTextStreamPrivate *this,QChar **ptr,qsizetype *length,qsizetype maxlen,
          TokenDelimiter delimiter)

{
  char16_t cVar1;
  QIODevice *pQVar2;
  long lVar3;
  char16_t cVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  qsizetype *pqVar8;
  qsizetype *pqVar9;
  QChar *pQVar10;
  long lVar11;
  char16_t cVar12;
  char16_t *pcVar13;
  bool bVar14;
  qsizetype qVar15;
  long lVar16;
  
  pqVar8 = &this->readBufferOffset;
  if (this->device == (QIODevice *)0x0) {
    pqVar8 = &this->stringOffset;
  }
  qVar15 = *pqVar8;
  pqVar8 = &(this->readBuffer).d.size;
  cVar12 = L'\0';
  lVar16 = 0;
  lVar11 = 0;
  bVar14 = false;
  while( true ) {
    pQVar2 = this->device;
    if (pQVar2 == (QIODevice *)0x0) {
      pcVar13 = (this->string->d).ptr;
      if (pcVar13 == (char16_t *)0x0) {
        pcVar13 = L"";
      }
      pqVar9 = &(this->string->d).size;
    }
    else {
      pcVar13 = (this->readBuffer).d.ptr;
      pqVar9 = pqVar8;
      if (pcVar13 == (char16_t *)0x0) {
        pcVar13 = L"";
      }
    }
    lVar3 = *pqVar9;
    bVar5 = false;
    while( true ) {
      if (((bVar5 != false) || (lVar3 <= qVar15)) || (maxlen != 0 && maxlen <= lVar16)) break;
      cVar1 = pcVar13[qVar15];
      if (delimiter == EndOfLine) {
        cVar4 = cVar1;
        if (cVar1 == L'\n') {
          bVar14 = true;
          bVar5 = true;
          lVar11 = (ulong)(cVar12 == L'\r') + 1;
          cVar4 = L'\n';
        }
      }
      else {
        cVar4 = cVar12;
        if (delimiter == NotSpace) {
          bVar5 = QChar::isSpace((uint)(ushort)cVar1);
          if (!bVar5) {
            lVar11 = 1;
          }
          bVar5 = !bVar5;
        }
        else if (delimiter == Space) {
          bVar5 = QChar::isSpace((uint)(ushort)cVar1);
          if (bVar5) {
            lVar11 = 1;
          }
        }
      }
      cVar12 = cVar4;
      qVar15 = qVar15 + 1;
      lVar16 = lVar16 + 1;
    }
    if (bVar5 != false) break;
    if (((pQVar2 == (QIODevice *)0x0) || (maxlen != 0 && maxlen <= lVar16)) ||
       (bVar6 = fillReadBuffer(this,-1), !bVar6)) break;
  }
  if (lVar16 != 0) {
    if (((0 < lVar16 && delimiter == EndOfLine) && bVar5 == false) &&
       (((this->string != (QString *)0x0 && ((this->string->d).size - this->stringOffset == lVar16))
        || ((this->device != (QIODevice *)0x0 &&
            (iVar7 = (*this->device->_vptr_QIODevice[8])(), (char)iVar7 != '\0')))))) {
      lVar11 = lVar11 + (ulong)(cVar12 == L'\r');
      bVar14 = (bool)(cVar12 == L'\r' | bVar14);
    }
    if (length != (qsizetype *)0x0) {
      *length = lVar16 - lVar11;
    }
    if (ptr != (QChar **)0x0) {
      pQVar10 = readPtr(this);
      *ptr = pQVar10;
    }
    if (bVar14) {
      lVar11 = 0;
    }
    this->lastTokenSize = lVar16 - lVar11;
  }
  return lVar16 != 0;
}

Assistant:

bool QTextStreamPrivate::scan(const QChar **ptr, qsizetype *length, qsizetype maxlen,
                              TokenDelimiter delimiter)
{
    qsizetype totalSize = 0;
    qsizetype delimSize = 0;
    bool consumeDelimiter = false;
    bool foundToken = false;
    qsizetype startOffset = device ? readBufferOffset : stringOffset;
    QChar lastChar;

    do {
        qsizetype endOffset;
        const QChar *chPtr;
        if (device) {
            chPtr = readBuffer.constData();
            endOffset = readBuffer.size();
        } else {
            chPtr = string->constData();
            endOffset = string->size();
        }
        chPtr += startOffset;

        for (; !foundToken && startOffset < endOffset && (!maxlen || totalSize < maxlen); ++startOffset) {
            const QChar ch = *chPtr++;
            ++totalSize;

            switch (delimiter) {
            case Space:
                if (ch.isSpace()) {
                    foundToken = true;
                    delimSize = 1;
                }
                break;
            case NotSpace:
                if (!ch.isSpace()) {
                    foundToken = true;
                    delimSize = 1;
                }
                break;
            case EndOfLine:
                if (ch == u'\n') {
                    foundToken = true;
                    delimSize = (lastChar == u'\r') ? 2 : 1;
                    consumeDelimiter = true;
                }
                lastChar = ch;
                break;
            }
        }
    } while (!foundToken
             && (!maxlen || totalSize < maxlen)
             && device && fillReadBuffer());

    if (totalSize == 0) {
#if defined (QTEXTSTREAM_DEBUG)
        qDebug("QTextStreamPrivate::scan() reached the end of input.");
#endif
        return false;
    }

    // if we find a '\r' at the end of the data when reading lines,
    // don't make it part of the line.
    if (delimiter == EndOfLine && totalSize > 0 && !foundToken) {
        if (((string && stringOffset + totalSize == string->size()) || (device && device->atEnd()))
            && lastChar == u'\r') {
            consumeDelimiter = true;
            ++delimSize;
        }
    }

    // set the read offset and length of the token
    if (length)
        *length = totalSize - delimSize;
    if (ptr)
        *ptr = readPtr();

    // update last token size. the callee will call consumeLastToken() when
    // done.
    lastTokenSize = totalSize;
    if (!consumeDelimiter)
        lastTokenSize -= delimSize;

#if defined (QTEXTSTREAM_DEBUG)
    qDebug("QTextStreamPrivate::scan(%p, %p, %d, %x) token length = %d, delimiter = %d",
           ptr, length, int(maxlen), uint(delimiter), int(totalSize - delimSize), int(delimSize));
#endif
    return true;
}